

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint uVar1;
  int iVar2;
  U32 UVar3;
  U32 UVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  uint local_328;
  uint local_324;
  BYTE *local_318;
  BYTE *local_308;
  searchMax_f local_2f8;
  BYTE *local_2f0;
  BYTE *local_2c8;
  BYTE *local_2b8;
  BYTE *local_288;
  BYTE *local_278;
  BYTE *local_258;
  BYTE *local_248;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  BYTE *repEnd2;
  BYTE *repMatch_3;
  U32 repIndex_3;
  U32 current2;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_5;
  int gain2_5;
  size_t ml2_2;
  size_t offset2_1;
  int gain1_4;
  int gain2_4;
  size_t mlRep_3;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  int local_170;
  U32 repIndex_2;
  int gain1_3;
  int gain2_3;
  size_t mlRep_2;
  int gain1_2;
  int gain2_2;
  size_t ml2_1;
  size_t offset2;
  int gain1_1;
  int gain2_1;
  size_t mlRep_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  int local_120;
  U32 repIndex_1;
  int gain1;
  int gain2;
  size_t mlRep;
  size_t ml2;
  size_t offsetFound;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_e8;
  U32 repIndex;
  BYTE *start;
  size_t offset;
  size_t matchLength;
  int local_c8;
  U32 maxRep;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictLowest;
  BYTE *dictBase;
  ZSTD_matchState_t *pZStack_a0;
  U32 dictLowestIndex;
  ZSTD_matchState_t *dms;
  uint local_90;
  U32 savedOffset;
  U32 offset_2;
  U32 offset_1;
  searchMax_f searchMax;
  BYTE *prefixLowest;
  BYTE *pBStack_70;
  U32 prefixLowestIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  int local_38;
  undefined4 local_34;
  size_t local_30;
  void *local_28;
  uint *local_20;
  seqStore_t *local_18;
  ZSTD_matchState_t *local_10;
  
  local_34 = 0;
  local_38 = 1;
  istart._4_4_ = 0;
  ilimit = (BYTE *)((long)src + srcSize);
  base = ilimit + -8;
  pBStack_70 = (ms->window).base;
  prefixLowest._4_4_ = (ms->window).dictLimit;
  searchMax = (searchMax_f)(pBStack_70 + prefixLowest._4_4_);
  _offset_2 = ZSTD_HcFindBestMatch_selectMLS;
  uVar5 = *rep;
  uVar1 = rep[1];
  dms._4_4_ = 0;
  pZStack_a0 = ms->dictMatchState;
  dictBase._4_4_ = 0;
  dictLowest = (BYTE *)0x0;
  dictEnd = (BYTE *)0x0;
  _dictAndPrefixLength = (BYTE *)0x0;
  maxRep = 0;
  local_c8 = (int)src - (int)searchMax;
  anchor = (BYTE *)((long)src + (long)(int)(uint)(local_c8 == 0));
  ms->nextToUpdate3 = ms->nextToUpdate;
  matchLength._4_4_ = (int)anchor - (int)searchMax;
  local_90 = uVar1;
  if (matchLength._4_4_ < uVar1) {
    local_90 = 0;
    dms._4_4_ = uVar1;
  }
  savedOffset = uVar5;
  iend = (BYTE *)src;
  ip = (BYTE *)src;
  local_30 = srcSize;
  local_28 = src;
  local_20 = rep;
  local_18 = seqStore;
  local_10 = ms;
  if (matchLength._4_4_ < uVar5) {
    savedOffset = 0;
    dms._4_4_ = uVar5;
  }
  do {
    while( true ) {
      if (base <= anchor) {
        if (savedOffset == 0) {
          local_324 = dms._4_4_;
        }
        else {
          local_324 = savedOffset;
        }
        *local_20 = local_324;
        if (local_90 == 0) {
          local_328 = dms._4_4_;
        }
        else {
          local_328 = local_90;
        }
        local_20[1] = local_328;
        return (long)ilimit - (long)iend;
      }
      offset = 0;
      start = (BYTE *)0x0;
      pBStack_e8 = anchor + 1;
      if (istart._4_4_ != 2) break;
      repMatch._4_4_ = (((int)anchor - (int)pBStack_70) + 1) - savedOffset;
      if (repMatch._4_4_ < prefixLowest._4_4_) {
        local_248 = dictLowest + (repMatch._4_4_ - maxRep);
      }
      else {
        local_248 = pBStack_70 + repMatch._4_4_;
      }
      repMatchEnd = local_248;
      if ((prefixLowest._4_4_ - 1) - repMatch._4_4_ < 3) break;
      UVar3 = MEM_read32(local_248);
      UVar4 = MEM_read32(anchor + 1);
      if (UVar3 != UVar4) break;
      if (repMatch._4_4_ < prefixLowest._4_4_) {
        local_258 = _dictAndPrefixLength;
      }
      else {
        local_258 = ilimit;
      }
      offsetFound = (size_t)local_258;
      sVar6 = ZSTD_count_2segments(anchor + 5,repMatchEnd + 4,ilimit,local_258,(BYTE *)searchMax);
      offset = sVar6 + 4;
      if (local_38 != 0) break;
LAB_0071b4f6:
      ZSTD_storeSeq(local_18,(long)pBStack_e8 - (long)iend,iend,(U32)start,offset - 3);
      iend = pBStack_e8 + offset;
      anchor = iend;
      if (istart._4_4_ == 2) {
        for (; iend = anchor, anchor <= base; anchor = anchor + offset) {
          uVar5 = ((int)anchor - (int)pBStack_70) - local_90;
          if ((istart._4_4_ == 2) && (uVar5 < prefixLowest._4_4_)) {
            local_308 = dictLowest + ((ulong)uVar5 - (ulong)maxRep);
          }
          else {
            local_308 = pBStack_70 + uVar5;
          }
          if ((prefixLowest._4_4_ - 1) - uVar5 < 3) break;
          UVar3 = MEM_read32(local_308);
          UVar4 = MEM_read32(anchor);
          if (UVar3 != UVar4) break;
          if (uVar5 < prefixLowest._4_4_) {
            local_318 = _dictAndPrefixLength;
          }
          else {
            local_318 = ilimit;
          }
          sVar6 = ZSTD_count_2segments(anchor + 4,local_308 + 4,ilimit,local_318,(BYTE *)searchMax);
          uVar5 = local_90;
          offset = sVar6 + 4;
          start = (BYTE *)(ulong)local_90;
          local_90 = savedOffset;
          savedOffset = uVar5;
          ZSTD_storeSeq(local_18,0,iend,0,sVar6 + 1);
        }
      }
      if (istart._4_4_ == 0) {
        while( true ) {
          bVar9 = false;
          if (anchor <= base && local_90 != 0) {
            UVar3 = MEM_read32(anchor);
            UVar4 = MEM_read32(anchor + -(ulong)local_90);
            bVar9 = UVar3 == UVar4;
          }
          if (!bVar9) break;
          sVar6 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)local_90),ilimit);
          uVar5 = local_90;
          offset = sVar6 + 4;
          start = (BYTE *)(ulong)local_90;
          local_90 = savedOffset;
          savedOffset = uVar5;
          ZSTD_storeSeq(local_18,0,iend,0,sVar6 + 1);
          iend = anchor + offset;
          anchor = iend;
        }
      }
    }
    if (istart._4_4_ == 0) {
      bVar9 = savedOffset != 0;
      UVar3 = MEM_read32(anchor + (1 - (ulong)savedOffset));
      UVar4 = MEM_read32(anchor + 1);
      if (bVar9 && UVar3 == UVar4) {
        sVar6 = ZSTD_count(anchor + 5,anchor + (5 - (ulong)savedOffset),ilimit);
        offset = sVar6 + 4;
        if (local_38 == 0) goto LAB_0071b4f6;
      }
    }
    ml2 = 999999999;
    mlRep = (*_offset_2)(local_10,anchor,ilimit,&ml2);
    if (offset < mlRep) {
      pBStack_e8 = anchor;
      start = (BYTE *)ml2;
      offset = mlRep;
    }
    if (3 < offset) {
      if (local_38 != 0) {
        while (anchor < base) {
          anchor = anchor + 1;
          if ((istart._4_4_ == 0) && (start != (BYTE *)0x0)) {
            bVar9 = savedOffset != 0;
            UVar3 = MEM_read32(anchor);
            UVar4 = MEM_read32(anchor + -(ulong)savedOffset);
            if (bVar9 && UVar3 == UVar4) {
              sVar6 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)savedOffset),ilimit);
              _gain1 = sVar6 + 4;
              repIndex_1 = (int)_gain1 * 3;
              iVar2 = (int)offset;
              UVar3 = ZSTD_highbit32((int)start + 1);
              local_120 = (iVar2 * 3 - UVar3) + 1;
              if ((3 < _gain1) && (local_120 < (int)repIndex_1)) {
                offset = _gain1;
                start = (BYTE *)0x0;
                pBStack_e8 = anchor;
              }
            }
          }
          if (istart._4_4_ == 2) {
            repMatch_1._4_4_ = ((int)anchor - (int)pBStack_70) - savedOffset;
            if (repMatch_1._4_4_ < prefixLowest._4_4_) {
              local_278 = dictLowest + (repMatch_1._4_4_ - maxRep);
            }
            else {
              local_278 = pBStack_70 + repMatch_1._4_4_;
            }
            repMatchEnd_1 = local_278;
            if (2 < (prefixLowest._4_4_ - 1) - repMatch_1._4_4_) {
              UVar3 = MEM_read32(local_278);
              UVar4 = MEM_read32(anchor);
              if (UVar3 == UVar4) {
                if (repMatch_1._4_4_ < prefixLowest._4_4_) {
                  local_288 = _dictAndPrefixLength;
                }
                else {
                  local_288 = ilimit;
                }
                mlRep_1 = (size_t)local_288;
                sVar6 = ZSTD_count_2segments
                                  (anchor + 4,repMatchEnd_1 + 4,ilimit,local_288,(BYTE *)searchMax);
                _gain1_1 = sVar6 + 4;
                offset2._4_4_ = (int)_gain1_1 * 3;
                iVar2 = (int)offset;
                UVar3 = ZSTD_highbit32((int)start + 1);
                offset2._0_4_ = (iVar2 * 3 - UVar3) + 1;
                if ((3 < _gain1_1) && ((int)offset2 < offset2._4_4_)) {
                  offset = _gain1_1;
                  start = (BYTE *)0x0;
                  pBStack_e8 = anchor;
                }
              }
            }
          }
          ml2_1 = 999999999;
          _gain1_2 = (*_offset_2)(local_10,anchor,ilimit,&ml2_1);
          lVar7 = _gain1_2 << 2;
          UVar3 = ZSTD_highbit32((int)ml2_1 + 1);
          mlRep_2._4_4_ = (int)lVar7 - UVar3;
          lVar7 = offset << 2;
          UVar3 = ZSTD_highbit32((int)start + 1);
          mlRep_2._0_4_ = ((int)lVar7 - UVar3) + 4;
          if ((_gain1_2 < 4) || (mlRep_2._4_4_ <= (int)mlRep_2)) {
            if ((local_38 != 2) || (base <= anchor)) break;
            anchor = anchor + 1;
            if ((istart._4_4_ == 0) && (start != (BYTE *)0x0)) {
              bVar9 = savedOffset != 0;
              UVar3 = MEM_read32(anchor);
              UVar4 = MEM_read32(anchor + -(ulong)savedOffset);
              if (bVar9 && UVar3 == UVar4) {
                sVar6 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)savedOffset),ilimit);
                _gain1_3 = sVar6 + 4;
                repIndex_2 = (int)_gain1_3 * 4;
                lVar7 = offset << 2;
                UVar3 = ZSTD_highbit32((int)start + 1);
                local_170 = ((int)lVar7 - UVar3) + 1;
                if ((3 < _gain1_3) && (local_170 < (int)repIndex_2)) {
                  offset = _gain1_3;
                  start = (BYTE *)0x0;
                  pBStack_e8 = anchor;
                }
              }
            }
            if (istart._4_4_ == 2) {
              repMatch_2._4_4_ = ((int)anchor - (int)pBStack_70) - savedOffset;
              if (repMatch_2._4_4_ < prefixLowest._4_4_) {
                local_2b8 = dictLowest + (repMatch_2._4_4_ - maxRep);
              }
              else {
                local_2b8 = pBStack_70 + repMatch_2._4_4_;
              }
              repMatchEnd_2 = local_2b8;
              if (2 < (prefixLowest._4_4_ - 1) - repMatch_2._4_4_) {
                UVar3 = MEM_read32(local_2b8);
                UVar4 = MEM_read32(anchor);
                if (UVar3 == UVar4) {
                  if (repMatch_2._4_4_ < prefixLowest._4_4_) {
                    local_2c8 = _dictAndPrefixLength;
                  }
                  else {
                    local_2c8 = ilimit;
                  }
                  mlRep_3 = (size_t)local_2c8;
                  sVar6 = ZSTD_count_2segments
                                    (anchor + 4,repMatchEnd_2 + 4,ilimit,local_2c8,(BYTE *)searchMax
                                    );
                  _gain1_4 = sVar6 + 4;
                  offset2_1._4_4_ = (int)_gain1_4 * 4;
                  lVar7 = offset << 2;
                  UVar3 = ZSTD_highbit32((int)start + 1);
                  offset2_1._0_4_ = ((int)lVar7 - UVar3) + 1;
                  if ((3 < _gain1_4) && ((int)offset2_1 < offset2_1._4_4_)) {
                    offset = _gain1_4;
                    start = (BYTE *)0x0;
                    pBStack_e8 = anchor;
                  }
                }
              }
            }
            ml2_2 = 999999999;
            uVar8 = (*_offset_2)(local_10,anchor,ilimit,&ml2_2);
            UVar3 = ZSTD_highbit32((int)ml2_2 + 1);
            lVar7 = offset << 2;
            UVar4 = ZSTD_highbit32((int)start + 1);
            if ((uVar8 < 4) || ((int)((int)(uVar8 << 2) - UVar3) <= (int)(((int)lVar7 - UVar4) + 7))
               ) break;
            start = (BYTE *)ml2_2;
            pBStack_e8 = anchor;
            offset = uVar8;
          }
          else {
            start = (BYTE *)ml2_1;
            pBStack_e8 = anchor;
            offset = _gain1_2;
          }
        }
      }
      if (start != (BYTE *)0x0) {
        if (istart._4_4_ == 0) {
          while( true ) {
            bVar9 = false;
            if (iend < pBStack_e8 && searchMax < pBStack_e8 + -(long)(start + -2)) {
              bVar9 = pBStack_e8[-1] == pBStack_e8[-1 - (long)(start + -2)];
            }
            if (!bVar9) break;
            pBStack_e8 = pBStack_e8 + -1;
            offset = offset + 1;
          }
        }
        if (istart._4_4_ == 2) {
          uVar5 = ((int)pBStack_e8 - (int)pBStack_70) - ((int)start + -2);
          if (uVar5 < prefixLowest._4_4_) {
            local_2f0 = dictLowest + ((ulong)uVar5 - (ulong)maxRep);
          }
          else {
            local_2f0 = pBStack_70 + uVar5;
          }
          mStart = local_2f0;
          if (uVar5 < prefixLowest._4_4_) {
            local_2f8 = (searchMax_f)dictEnd;
          }
          else {
            local_2f8 = searchMax;
          }
          while( true ) {
            bVar9 = false;
            if ((iend < pBStack_e8) && (bVar9 = false, local_2f8 < mStart)) {
              bVar9 = pBStack_e8[-1] == mStart[-1];
            }
            if (!bVar9) break;
            pBStack_e8 = pBStack_e8 + -1;
            mStart = mStart + -1;
            offset = offset + 1;
          }
        }
        local_90 = savedOffset;
        savedOffset = (int)start - 2;
      }
      goto LAB_0071b4f6;
    }
    anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 1, ZSTD_noDict);
}